

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

void __thiscall
CVmObjFile::alloc_ext
          (CVmObjFile *this,CVmNetFile *netfile,vm_obj_id_t charset,CVmDataSource *fp,
          unsigned_long flags,int mode,int access,int create_readbuf)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  vmobjfile_ext_t *pvVar3;
  vmobjfile_ext_t *pvVar4;
  CVmDataSource *in_RCX;
  vm_obj_id_t in_EDX;
  CVmNetFile *in_RSI;
  CVmObjFile *in_RDI;
  unsigned_long in_R8;
  uchar in_R9B;
  uchar in_stack_00000008;
  int in_stack_00000010;
  vmobjfile_readbuf_t *rb;
  size_t siz;
  undefined8 local_38;
  
  (*(in_RDI->super_CVmObject)._vptr_CVmObject[2])(in_RDI,0);
  local_38 = 0x28;
  if (in_stack_00000010 != 0) {
    local_38 = 0x238;
  }
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,local_38,in_RDI);
  (in_RDI->super_CVmObject).ext_ = (char *)CONCAT44(extraout_var,iVar1);
  pvVar3 = get_ext(in_RDI);
  pvVar3->netfile = in_RSI;
  pvVar3 = get_ext(in_RDI);
  pvVar3->fp = in_RCX;
  pvVar3 = get_ext(in_RDI);
  pvVar3->charset = in_EDX;
  pvVar3 = get_ext(in_RDI);
  pvVar3->flags = in_R8;
  pvVar3 = get_ext(in_RDI);
  pvVar3->mode = in_R9B;
  pvVar3 = get_ext(in_RDI);
  pvVar3->access = in_stack_00000008;
  if (in_stack_00000010 == 0) {
    pvVar3 = get_ext(in_RDI);
    pvVar3->readbuf = (vmobjfile_readbuf_t *)0x0;
  }
  else {
    pvVar3 = get_ext(in_RDI);
    pvVar4 = get_ext(in_RDI);
    pvVar4->readbuf = (vmobjfile_readbuf_t *)(pvVar3 + 1);
    pvVar3[1].fp = (CVmDataSource *)0x0;
    ((vmobjfile_readbuf_t *)(pvVar3 + 1))->ptr = (char *)&pvVar3[1].charset;
  }
  return;
}

Assistant:

void CVmObjFile::alloc_ext(VMG_ CVmNetFile *netfile,
                           vm_obj_id_t charset, CVmDataSource *fp,
                           unsigned long flags, int mode, int access,
                           int create_readbuf)
{
    /* 
     *   if we already have an extension, delete it (and release our
     *   underlying system file, if any) 
     */
    notify_delete(vmg_ FALSE);

    /* 
     *   Figure the needed size.  We need at least the standard extension;
     *   if we also need a read buffer, figure in space for that as well. 
     */
    size_t siz = sizeof(vmobjfile_ext_t);
    if (create_readbuf)
        siz += sizeof(vmobjfile_readbuf_t);

    /* allocate space for our extension structure */
    ext_ = (char *)G_mem->get_var_heap()->alloc_mem(siz, this);

    /* store the data we received from the caller */
    get_ext()->netfile = netfile;
    get_ext()->fp = fp;
    get_ext()->charset = charset;
    get_ext()->flags = flags;
    get_ext()->mode = (unsigned char)mode;
    get_ext()->access = (unsigned char)access;

    /* 
     *   point to our read buffer, for which we allocated space contiguously
     *   with and immediately following our extension, if we have one 
     */
    if (create_readbuf)
    {
        /* point to our read buffer object */
        vmobjfile_readbuf_t *rb = (vmobjfile_readbuf_t *)(get_ext() + 1);
        get_ext()->readbuf = rb;

        /* initialize the read buffer with no initial data */
        rb->rem = 0;
        rb->ptr = rb->buf;
    }
    else
    {
        /* there's no read buffer at all */
        get_ext()->readbuf = 0;
    }
}